

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

SOURCE_HANDLE source_create(void)

{
  SOURCE_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (SOURCE_HANDLE)malloc(8);
  if (__ptr != (SOURCE_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x28);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (SOURCE_HANDLE)0x0;
}

Assistant:

SOURCE_HANDLE source_create(void)
{
    SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)malloc(sizeof(SOURCE_INSTANCE));
    if (source_instance != NULL)
    {
        source_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(40);
        if (source_instance->composite_value == NULL)
        {
            free(source_instance);
            source_instance = NULL;
        }
    }

    return source_instance;
}